

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.cpp
# Opt level: O3

void __thiscall Log::update_individual_log(Log *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  uint uVar2;
  Graph *pGVar3;
  pointer pcVar4;
  pointer pbVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  long *plVar9;
  undefined8 *puVar10;
  pointer ppGVar11;
  ulong *puVar12;
  size_type *psVar13;
  pointer ppPVar14;
  undefined8 *puVar15;
  ulong uVar16;
  ulong uVar17;
  undefined8 uVar18;
  ulong uVar19;
  Log *pLVar20;
  uint uVar21;
  pointer pbVar22;
  string s;
  string graph_string;
  string __str_1;
  string log;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_198;
  undefined8 *local_178;
  undefined8 local_170;
  undefined8 local_168;
  undefined8 uStack_160;
  undefined8 *local_158;
  undefined8 local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  ulong *local_138;
  long local_130;
  ulong local_128;
  long lStack_120;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  Log *local_98;
  ulong *local_90;
  long local_88;
  ulong local_80 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  std::operator+(&local_d8,"Label:\t\t",&this->label);
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_d8);
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  puVar12 = (ulong *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar12) {
    local_f8.field_2._M_allocated_capacity = *puVar12;
    local_f8.field_2._8_8_ = plVar9[3];
  }
  else {
    local_f8.field_2._M_allocated_capacity = *puVar12;
    local_f8._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_f8._M_string_length = plVar9[1];
  *plVar9 = (long)puVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  uVar2 = this->total;
  uVar6 = -uVar2;
  if (0 < (int)uVar2) {
    uVar6 = uVar2;
  }
  uVar21 = 1;
  if (9 < uVar6) {
    uVar17 = (ulong)uVar6;
    uVar7 = 4;
    do {
      uVar21 = uVar7;
      uVar8 = (uint)uVar17;
      if (uVar8 < 100) {
        uVar21 = uVar21 - 2;
        goto LAB_00105a0e;
      }
      if (uVar8 < 1000) {
        uVar21 = uVar21 - 1;
        goto LAB_00105a0e;
      }
      if (uVar8 < 10000) goto LAB_00105a0e;
      uVar17 = uVar17 / 10000;
      uVar7 = uVar21 + 4;
    } while (99999 < uVar8);
    uVar21 = uVar21 + 1;
  }
LAB_00105a0e:
  local_98 = this;
  local_90 = local_80;
  std::__cxx11::string::_M_construct((ulong)&local_90,(char)uVar21 - (char)((int)uVar2 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar2 >> 0x1f) + (long)local_90),uVar21,uVar6);
  pLVar20 = local_98;
  uVar18 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    uVar18 = local_f8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar18 < local_88 + local_f8._M_string_length) {
    uVar17 = 0xf;
    if (local_90 != local_80) {
      uVar17 = local_80[0];
    }
    if (uVar17 < local_88 + local_f8._M_string_length) goto LAB_00105aab;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_90,0,(char *)0x0,(ulong)local_f8._M_dataplus._M_p);
  }
  else {
LAB_00105aab:
    puVar10 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f8,(ulong)local_90);
  }
  local_158 = &local_148;
  puVar15 = puVar10 + 2;
  if ((undefined8 *)*puVar10 == puVar15) {
    local_148 = *puVar15;
    uStack_140 = puVar10[3];
  }
  else {
    local_148 = *puVar15;
    local_158 = (undefined8 *)*puVar10;
  }
  local_150 = puVar10[1];
  *puVar10 = puVar15;
  puVar10[1] = 0;
  *(undefined1 *)puVar15 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_158);
  puVar12 = (ulong *)(plVar9 + 2);
  if ((ulong *)*plVar9 == puVar12) {
    local_128 = *puVar12;
    lStack_120 = plVar9[3];
    local_138 = &local_128;
  }
  else {
    local_128 = *puVar12;
    local_138 = (ulong *)*plVar9;
  }
  local_130 = plVar9[1];
  *plVar9 = (long)puVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_50,vsnprintf,0x148,"%f",SUB84(pLVar20->average,0));
  uVar17 = 0xf;
  if (local_138 != &local_128) {
    uVar17 = local_128;
  }
  if (uVar17 < local_50._M_string_length + local_130) {
    uVar18 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      uVar18 = local_50.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar18 < local_50._M_string_length + local_130) goto LAB_00105be1;
    puVar10 = (undefined8 *)
              std::__cxx11::string::replace((ulong)&local_50,0,(char *)0x0,(ulong)local_138);
  }
  else {
LAB_00105be1:
    puVar10 = (undefined8 *)
              std::__cxx11::string::_M_append((char *)&local_138,(ulong)local_50._M_dataplus._M_p);
  }
  local_178 = &local_168;
  puVar15 = puVar10 + 2;
  if ((undefined8 *)*puVar10 == puVar15) {
    local_168 = *puVar15;
    uStack_160 = puVar10[3];
  }
  else {
    local_168 = *puVar15;
    local_178 = (undefined8 *)*puVar10;
  }
  local_170 = puVar10[1];
  *puVar10 = puVar15;
  puVar10[1] = 0;
  *(undefined1 *)puVar15 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_178);
  local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
  puVar12 = (ulong *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar12) {
    local_198.field_2._M_allocated_capacity = *puVar12;
    local_198.field_2._8_8_ = plVar9[3];
  }
  else {
    local_198.field_2._M_allocated_capacity = *puVar12;
    local_198._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_198._M_string_length = plVar9[1];
  *plVar9 = (long)puVar12;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  __gnu_cxx::__to_xstring<std::__cxx11::string,char>
            (&local_70,vsnprintf,0x148,"%f",SUB84(pLVar20->last,0));
  uVar18 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    uVar18 = local_198.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar18 < local_70._M_string_length + local_198._M_string_length) {
    uVar18 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      uVar18 = local_70.field_2._M_allocated_capacity;
    }
    if (local_70._M_string_length + local_198._M_string_length <= (ulong)uVar18) {
      puVar10 = (undefined8 *)
                std::__cxx11::string::replace
                          ((ulong)&local_70,0,(char *)0x0,(ulong)local_198._M_dataplus._M_p);
      goto LAB_00105d32;
    }
  }
  puVar10 = (undefined8 *)
            std::__cxx11::string::_M_append((char *)&local_198,(ulong)local_70._M_dataplus._M_p);
LAB_00105d32:
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  puVar12 = puVar10 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar10 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar12) {
    local_118.field_2._M_allocated_capacity = *puVar12;
    local_118.field_2._8_8_ = puVar10[3];
  }
  else {
    local_118.field_2._M_allocated_capacity = *puVar12;
    local_118._M_dataplus._M_p = (pointer)*puVar10;
  }
  local_118._M_string_length = puVar10[1];
  *puVar10 = puVar12;
  puVar10[1] = 0;
  *(undefined1 *)puVar12 = 0;
  plVar9 = (long *)std::__cxx11::string::append((char *)&local_118);
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  psVar13 = (size_type *)(plVar9 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar9 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar13) {
    local_b8.field_2._M_allocated_capacity = *psVar13;
    local_b8.field_2._8_8_ = plVar9[3];
  }
  else {
    local_b8.field_2._M_allocated_capacity = *psVar13;
    local_b8._M_dataplus._M_p = (pointer)*plVar9;
  }
  local_b8._M_string_length = plVar9[1];
  *plVar9 = (long)psVar13;
  plVar9[1] = 0;
  *(undefined1 *)(plVar9 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != &local_198.field_2) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  if (local_178 != &local_168) {
    operator_delete(local_178);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (local_138 != &local_128) {
    operator_delete(local_138);
  }
  if (local_158 != &local_148) {
    operator_delete(local_158);
  }
  if (local_90 != local_80) {
    operator_delete(local_90);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  local_118._M_string_length = 0;
  local_118.field_2._M_allocated_capacity =
       local_118.field_2._M_allocated_capacity & 0xffffffffffffff00;
  std::__cxx11::string::append((char *)&local_b8);
  if ((pLVar20->graphs).super__Vector_base<Graph_*,_std::allocator<Graph_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (pLVar20->graphs).super__Vector_base<Graph_*,_std::allocator<Graph_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar17 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"\n",1);
      pGVar3 = (pLVar20->graphs).super__Vector_base<Graph_*,_std::allocator<Graph_*>_>._M_impl.
               super__Vector_impl_data._M_start[uVar17];
      local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
      pcVar4 = (pGVar3->label)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_198,pcVar4,pcVar4 + (pGVar3->label)._M_string_length);
      std::__cxx11::string::append((char *)&local_198);
      std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_198._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != &local_198.field_2) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      ppGVar11 = (pLVar20->graphs).super__Vector_base<Graph_*,_std::allocator<Graph_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      ppPVar14 = (ppGVar11[uVar17]->points).super__Vector_base<Point_*,_std::allocator<Point_*>_>.
                 _M_impl.super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&(ppGVar11[uVar17]->points).super__Vector_base<Point_*,_std::allocator<Point_*>_>.
                   _M_impl + 8) != ppPVar14) {
        uVar19 = 0;
        do {
          __gnu_cxx::__to_xstring<std::__cxx11::string,char>
                    (&local_f8,vsnprintf,0x148,"%f",SUB84(ppPVar14[uVar19]->x,0));
          puVar10 = (undefined8 *)
                    std::__cxx11::string::replace((ulong)&local_f8,0,(char *)0x0,0x108511);
          local_158 = &local_148;
          puVar15 = puVar10 + 2;
          if ((undefined8 *)*puVar10 == puVar15) {
            local_148 = *puVar15;
            uStack_140 = puVar10[3];
          }
          else {
            local_148 = *puVar15;
            local_158 = (undefined8 *)*puVar10;
          }
          local_150 = puVar10[1];
          *puVar10 = puVar15;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_158);
          puVar12 = puVar10 + 2;
          if ((ulong *)*puVar10 == puVar12) {
            local_128 = *puVar12;
            lStack_120 = puVar10[3];
            local_138 = &local_128;
          }
          else {
            local_128 = *puVar12;
            local_138 = (ulong *)*puVar10;
          }
          local_130 = puVar10[1];
          *puVar10 = puVar12;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          uVar2 = *(uint *)(*(long *)(*(long *)&((pLVar20->graphs).
                                                 super__Vector_base<Graph_*,_std::allocator<Graph_*>_>
                                                 ._M_impl.super__Vector_impl_data._M_start[uVar17]->
                                                points).
                                                super__Vector_base<Point_*,_std::allocator<Point_*>_>
                                                ._M_impl.super__Vector_impl_data + uVar19 * 8) + 8);
          uVar6 = -uVar2;
          if (0 < (int)uVar2) {
            uVar6 = uVar2;
          }
          uVar21 = 1;
          if (9 < uVar6) {
            uVar16 = (ulong)uVar6;
            uVar7 = 4;
            do {
              uVar21 = uVar7;
              uVar8 = (uint)uVar16;
              if (uVar8 < 100) {
                uVar21 = uVar21 - 2;
                goto LAB_001060d9;
              }
              if (uVar8 < 1000) {
                uVar21 = uVar21 - 1;
                goto LAB_001060d9;
              }
              if (uVar8 < 10000) goto LAB_001060d9;
              uVar16 = uVar16 / 10000;
              uVar7 = uVar21 + 4;
            } while (99999 < uVar8);
            uVar21 = uVar21 + 1;
          }
LAB_001060d9:
          local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
          std::__cxx11::string::_M_construct
                    ((ulong)&local_d8,(char)uVar21 - (char)((int)uVar2 >> 0x1f));
          std::__detail::__to_chars_10_impl<unsigned_int>
                    (local_d8._M_dataplus._M_p + (uVar2 >> 0x1f),uVar21,uVar6);
          pLVar20 = local_98;
          uVar16 = 0xf;
          if (local_138 != &local_128) {
            uVar16 = local_128;
          }
          if (uVar16 < local_d8._M_string_length + local_130) {
            uVar18 = 0xf;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
              uVar18 = local_d8.field_2._M_allocated_capacity;
            }
            if ((ulong)uVar18 < local_d8._M_string_length + local_130) goto LAB_00106176;
            puVar10 = (undefined8 *)
                      std::__cxx11::string::replace((ulong)&local_d8,0,(char *)0x0,(ulong)local_138)
            ;
          }
          else {
LAB_00106176:
            puVar10 = (undefined8 *)
                      std::__cxx11::string::_M_append
                                ((char *)&local_138,(ulong)local_d8._M_dataplus._M_p);
          }
          local_178 = &local_168;
          puVar15 = puVar10 + 2;
          if ((undefined8 *)*puVar10 == puVar15) {
            local_168 = *puVar15;
            uStack_160 = puVar10[3];
          }
          else {
            local_168 = *puVar15;
            local_178 = (undefined8 *)*puVar10;
          }
          local_170 = puVar10[1];
          *puVar10 = puVar15;
          puVar10[1] = 0;
          *(undefined1 *)puVar15 = 0;
          puVar10 = (undefined8 *)std::__cxx11::string::append((char *)&local_178);
          local_198._M_dataplus._M_p = (pointer)&local_198.field_2;
          puVar12 = puVar10 + 2;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)*puVar10 ==
              (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)puVar12) {
            local_198.field_2._M_allocated_capacity = *puVar12;
            local_198.field_2._8_8_ = puVar10[3];
          }
          else {
            local_198.field_2._M_allocated_capacity = *puVar12;
            local_198._M_dataplus._M_p = (pointer)*puVar10;
          }
          local_198._M_string_length = puVar10[1];
          *puVar10 = puVar12;
          puVar10[1] = 0;
          *(undefined1 *)(puVar10 + 2) = 0;
          std::__cxx11::string::_M_append((char *)&local_118,(ulong)local_198._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_198._M_dataplus._M_p != &local_198.field_2) {
            operator_delete(local_198._M_dataplus._M_p);
          }
          if (local_178 != &local_168) {
            operator_delete(local_178);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
            operator_delete(local_d8._M_dataplus._M_p);
          }
          if (local_138 != &local_128) {
            operator_delete(local_138);
          }
          if (local_158 != &local_148) {
            operator_delete(local_158);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
            operator_delete(local_f8._M_dataplus._M_p);
          }
          uVar19 = uVar19 + 1;
          ppGVar11 = (pLVar20->graphs).super__Vector_base<Graph_*,_std::allocator<Graph_*>_>._M_impl
                     .super__Vector_impl_data._M_start;
          ppPVar14 = (ppGVar11[uVar17]->points).
                     super__Vector_base<Point_*,_std::allocator<Point_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
        } while (uVar19 < (ulong)((long)*(pointer *)
                                         ((long)&(ppGVar11[uVar17]->points).
                                                 super__Vector_base<Point_*,_std::allocator<Point_*>_>
                                                 ._M_impl + 8) - (long)ppPVar14 >> 3));
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < (ulong)((long)(pLVar20->graphs).
                                    super__Vector_base<Graph_*,_std::allocator<Graph_*>_>._M_impl.
                                    super__Vector_impl_data._M_finish - (long)ppGVar11 >> 3));
  }
  std::__cxx11::string::append((char *)&local_b8);
  pbVar22 = (pLVar20->rawText).
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar5 = (pLVar20->rawText).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  paVar1 = &local_198.field_2;
  if (pbVar22 != pbVar5) {
    do {
      pcVar4 = (pbVar22->_M_dataplus)._M_p;
      local_198._M_dataplus._M_p = (pointer)paVar1;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_198,pcVar4,pcVar4 + pbVar22->_M_string_length);
      std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_198._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_198._M_dataplus._M_p != paVar1) {
        operator_delete(local_198._M_dataplus._M_p);
      }
      pbVar22 = pbVar22 + 1;
    } while (pbVar22 != pbVar5);
  }
  std::operator+(&local_198,&local_b8,&local_118);
  std::__cxx11::string::operator=((string *)&local_b8,(string *)&local_198);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_198._M_dataplus._M_p != paVar1) {
    operator_delete(local_198._M_dataplus._M_p);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&records_abi_cxx11_,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  return;
}

Assistant:

void Log::update_individual_log() {
    std::string log =
            "Label:\t\t" + label + "\nTotal:\t\t" + std::to_string(total) + "\nAverage:\t" + std::to_string(average) +
            " seconds\nLast:\t\t"
            + std::to_string(last) + " seconds";
    std::string graph_string;
    log += "\nGraphs:\t";
    for (int i = 0; i < graphs.size(); i++) {
        std::cout << "\n";
        graph_string += graphs[i]->label + ":\t";
        for (int j = 0; j < graphs[i]->points.size(); j++) {
            graph_string +=
                    "(" + std::to_string(graphs[i]->points[j]->x) + "," + std::to_string(graphs[i]->points[j]->y) + "),";
        }


    }

    log+= "\nRaw Text\n";
    for(std::string s : rawText)
    {
        log+= s;
    }
    log = log + graph_string;

    Log::records.push_back(log);
}